

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

void sysbvm_boolean_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_t *context_local;
  
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).booleanType,"not",1,0x1c,(void *)0x0,
             sysbvm_boolean_primitive_not);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).booleanType,"|",2,0x1c,(void *)0x0,
             sysbvm_boolean_primitive_xor);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).booleanType,"asUInt8",1,0x1c,(void *)0x0,
             sysbvm_boolean_primitive_asUInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).booleanType,"asInt8",1,0x1c,(void *)0x0,
             sysbvm_boolean_primitive_asInt8);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).boolean16Type,"asUInt16",1,0x1c,(void *)0x0,
             sysbvm_boolean16_primitive_asUInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).boolean16Type,"asInt16",1,0x1c,(void *)0x0,
             sysbvm_boolean16_primitive_asInt16);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).boolean32Type,"asUInt32",1,0x1c,(void *)0x0,
             sysbvm_boolean32_primitive_asUInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).boolean32Type,"asInt32",1,0x1c,(void *)0x0,
             sysbvm_boolean32_primitive_asInt32);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).boolean64Type,"asUInt64",1,0x1c,(void *)0x0,
             sysbvm_boolean64_primitive_asUInt64);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).boolean64Type,"asInt64",1,0x1c,(void *)0x0,
             sysbvm_boolean64_primitive_asInt64);
  return;
}

Assistant:

void sysbvm_boolean_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.booleanType, "not", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean_primitive_not);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.booleanType, "|", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean_primitive_xor);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.booleanType, "asUInt8", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean_primitive_asUInt8);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.booleanType, "asInt8", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean_primitive_asInt8);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.boolean16Type, "asUInt16", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean16_primitive_asUInt16);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.boolean16Type, "asInt16", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean16_primitive_asInt16);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.boolean32Type, "asUInt32", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean32_primitive_asUInt32);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.boolean32Type, "asInt32", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean32_primitive_asInt32);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.boolean64Type, "asUInt64", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean64_primitive_asUInt64);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.boolean64Type, "asInt64", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_boolean64_primitive_asInt64);
}